

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mos6502.cpp
# Opt level: O0

Pipeline * __thiscall
n_e_s::core::Mos6502::create_compare_instruction
          (Pipeline *__return_storage_ptr__,Mos6502 *this,Opcode opcode)

{
  Family family;
  anon_class_16_2_633ba7c1 local_e0;
  StepT local_d0;
  Pipeline local_a0;
  undefined1 local_45;
  MemoryAccess local_44;
  uint8_t *puStack_40;
  MemoryAccess memory_access;
  uint8_t *reg;
  Mos6502 *this_local;
  AddressMode local_24;
  undefined8 local_1c;
  Opcode opcode_local;
  Pipeline *result;
  
  local_24 = opcode.address_mode;
  register0x00000010 = opcode._0_8_;
  puStack_40 = (uint8_t *)0x0;
  local_1c._0_4_ = opcode.family;
  family = (Family)local_1c;
  if ((Family)local_1c == CPX) {
    puStack_40 = &this->registers_->x;
  }
  else if ((Family)local_1c == CPY) {
    puStack_40 = &this->registers_->y;
  }
  else if ((Family)local_1c == CMP) {
    puStack_40 = &this->registers_->a;
  }
  reg = (uint8_t *)this;
  local_1c = register0x00000010;
  opcode_local.family = local_24;
  opcode_local._4_8_ = __return_storage_ptr__;
  local_44 = get_memory_access(family);
  local_45 = 0;
  Pipeline::Pipeline(__return_storage_ptr__);
  create_addressing_steps(&local_a0,this,opcode_local.family,local_44);
  Pipeline::append(__return_storage_ptr__,&local_a0);
  Pipeline::~Pipeline(&local_a0);
  local_e0.reg = puStack_40;
  local_e0.this = this;
  std::function<void()>::
  function<n_e_s::core::Mos6502::create_compare_instruction(n_e_s::core::Opcode)::__0,void>
            ((function<void()> *)&local_d0,&local_e0);
  Pipeline::push(__return_storage_ptr__,&local_d0);
  std::function<void_()>::~function(&local_d0);
  return __return_storage_ptr__;
}

Assistant:

Pipeline Mos6502::create_compare_instruction(Opcode opcode) {
    uint8_t *reg{};
    if (opcode.family == Family::CPX) {
        reg = &registers_->x;
    } else if (opcode.family == Family::CPY) {
        reg = &registers_->y;
    } else if (opcode.family == Family::CMP) {
        reg = &registers_->a;
    }

    const MemoryAccess memory_access = get_memory_access(opcode.family);
    Pipeline result;
    result.append(create_addressing_steps(opcode.address_mode, memory_access));
    result.push([this, reg] {
        const uint8_t value = mmu_->read_byte(effective_address_);
        // Compare instructions are not affected be the
        // carry flag when executing the subtraction.
        const int16_t temp_result = *reg - value;
        set_carry(*reg >= value);
        set_zero(static_cast<uint8_t>(temp_result));
        set_negative(static_cast<uint8_t>(temp_result));
    });
    return result;
}